

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseArray(Parser *this,Value *array)

{
  BaseType BVar1;
  StructDef *pSVar2;
  EnumDef *pEVar3;
  Value *pVVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  uoffset_t uVar8;
  int iVar9;
  uoffset64_t element;
  Type *in_RDX;
  Parser *this_00;
  Parser *this_01;
  Value *val;
  ulong uVar10;
  bool bVar11;
  CheckedError err;
  uint8_t elem;
  vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> stack;
  size_type __dnew;
  FlatBufferBuilder builder;
  undefined1 local_134 [12];
  Value local_128;
  vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> local_d8;
  Type *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  char *local_a0;
  uint local_98;
  size_t local_90;
  _Alloc_hider local_88;
  uint local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined6 uStack_68;
  undefined8 uStack_62;
  pointer local_58;
  undefined2 local_50;
  size_t local_48;
  undefined2 local_40;
  _Base_ptr local_38;
  
  local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (Value *)0x0;
  local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (Value *)0x0;
  local_b0._0_8_ = (Allocator *)0x0;
  local_b0[8] = false;
  local_a0 = (char *)0x400;
  local_98 = 0x7fffffff;
  local_90 = 8;
  local_88._M_p = (pointer)0x0;
  local_80 = 0;
  local_58 = (pointer)0x0;
  local_50 = 0;
  local_78._M_allocated_capacity = 0;
  local_78._8_6_ = 0;
  local_78._14_2_ = 0;
  uStack_68 = 0;
  uStack_62 = 0;
  local_48 = 1;
  local_40 = 0x100;
  local_38 = (_Base_ptr)0x0;
  BVar1 = in_RDX->element;
  pSVar2 = in_RDX->struct_def;
  pEVar3 = in_RDX->enum_def;
  local_134._2_2_ = in_RDX->fixed_length;
  this_01 = (Parser *)local_134;
  local_c0 = in_RDX;
  Expect(this_01,(int)array);
  local_134[1] = 1;
  local_134._4_8_ = this;
  if (local_134[0] == '\0') {
    paVar5 = &local_128.constant.field_2;
    uVar10 = 0;
    do {
      if (((byte)(uVar10 == 0 | array[0xd].field_0x42 ^ 1) == 1) &&
         (*(int *)&(array->type).field_0x1c == 0x5d)) {
LAB_00114612:
        this_01 = (Parser *)local_134;
        Next(this_01);
        uVar6 = local_134._0_2_;
        local_134._0_2_ = local_134._0_2_ & 0xff;
        uVar7 = local_134._0_2_;
        local_134[0] = (char)uVar6;
        bVar11 = local_134[0] == '\0';
        local_134._0_2_ = uVar7;
        if (bVar11) {
          local_134._0_2_ = 0;
        }
        break;
      }
      local_128.type.enum_def._0_2_ = 0;
      local_128.type.enum_def._2_6_ = 0;
      local_128.type.fixed_length = 0;
      local_128.type._0_8_ = (char *)0x0;
      local_128.type.struct_def._0_2_ = 0;
      local_128.type.struct_def._2_6_ = 0;
      local_128.constant.field_2._M_allocated_capacity._0_2_ = 0x30;
      local_128.constant._M_string_length = 1;
      local_128.offset = 0xffff;
      local_128.constant._M_dataplus._M_p = (pointer)paVar5;
      std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::
      emplace_back<flatbuffers::Value>(&local_d8,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.constant._M_dataplus._M_p != paVar5) {
        operator_delete(local_128.constant._M_dataplus._M_p,
                        CONCAT62(local_128.constant.field_2._2_6_,
                                 local_128.constant.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.base_type = BVar1;
      local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.element = BASE_TYPE_NONE;
      local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.struct_def = pSVar2;
      local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.enum_def = pEVar3;
      local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.fixed_length = local_134._2_2_;
      if ((BVar1 == BASE_TYPE_STRUCT) && (pSVar2->fixed == true)) {
        this_01 = (Parser *)local_134;
        ParseTable(this_01,(StructDef *)array,(string *)pSVar2,
                   (uoffset_t *)
                   &local_d8.
                    super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].constant);
      }
      else {
        this_01 = (Parser *)local_134;
        ParseSingleValue(this_01,(string *)array,(Value *)0x0,
                         (bool)((char)local_d8.
                                      super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -0x48));
      }
      if (local_134[0] == '\0') {
        local_134[0] = '\0';
      }
      local_134[1] = 1;
      if (local_134[0] != '\0') break;
      uVar10 = uVar10 + 1;
      if (*(int *)&(array->type).field_0x1c == 0x5d) goto LAB_00114612;
      if (array[0x12].constant.field_2._M_local_buf[8] == '\0') {
        this_01 = (Parser *)local_134;
        Expect(this_01,(int)array);
        if (local_134[0] == '\0') goto LAB_001145f9;
      }
      else {
LAB_001145f9:
        local_134[0] = '\0';
      }
      local_134[1] = 1;
    } while (local_134[0] == '\0');
  }
  else {
    uVar10 = 0;
  }
  this_00 = (Parser *)local_134._4_8_;
  *(char *)&((ParserState *)local_134._4_8_)->prev_cursor_ = local_134[0];
  *(undefined1 *)((long)&((ParserState *)local_134._4_8_)->prev_cursor_ + 1) = 0;
  local_134[1] = '\x01';
  *(undefined1 *)((long)&((ParserState *)local_134._4_8_)->prev_cursor_ + 1) = 1;
  if (local_134[0] == '\0') {
    if (uVar10 == (ushort)local_134._2_2_) {
      if (local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_d8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pVVar4 = local_d8.
                 super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        do {
          val = pVVar4 + -1;
          switch((val->type).base_type) {
          case BASE_TYPE_NONE:
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(uchar *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_128.type.base_type
                      );
            break;
          case BASE_TYPE_UTYPE:
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(uchar *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_128.type.base_type
                      );
            break;
          case BASE_TYPE_BOOL:
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(uchar *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_128.type.base_type
                      );
            break;
          case BASE_TYPE_CHAR:
            anon_unknown_0::atot<signed_char>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(char *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_128.type.base_type
                      );
            break;
          case BASE_TYPE_UCHAR:
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(uchar *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_128.type.base_type
                      );
            break;
          case BASE_TYPE_SHORT:
            anon_unknown_0::atot<short>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(short *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(undefined2)local_128.type.base_type
                      );
            break;
          case BASE_TYPE_USHORT:
            anon_unknown_0::atot<unsigned_short>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(unsigned_short *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(undefined2)local_128.type.base_type
                      );
            break;
          case BASE_TYPE_INT:
            anon_unknown_0::atot<int>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(int *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,local_128.type.base_type);
            break;
          case BASE_TYPE_UINT:
            anon_unknown_0::atot<unsigned_int>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(uint *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,local_128.type.base_type);
            break;
          case BASE_TYPE_LONG:
            anon_unknown_0::atot<long>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(long *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,local_128.type._0_8_);
            break;
          case BASE_TYPE_ULONG:
            anon_unknown_0::atot<unsigned_long>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(unsigned_long *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,local_128.type._0_8_);
            break;
          case BASE_TYPE_FLOAT:
            anon_unknown_0::atot<float>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(float *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(float)local_128.type.base_type);
            break;
          case BASE_TYPE_DOUBLE:
            anon_unknown_0::atot<double>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(double *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,(double)local_128.type._0_8_);
            break;
          case BASE_TYPE_STRING:
            uVar8 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
            *(undefined2 *)&(this_00->super_ParserState).prev_cursor_ = 0x100;
            uVar8 = FlatBufferBuilderImpl<false>::ReferTo
                              ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
            break;
          case BASE_TYPE_VECTOR:
            uVar8 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
            *(undefined2 *)&(this_00->super_ParserState).prev_cursor_ = 0x100;
            uVar8 = FlatBufferBuilderImpl<false>::ReferTo
                              ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
            break;
          case BASE_TYPE_STRUCT:
            pSVar2 = pVVar4[-1].type.struct_def;
            if (pSVar2->fixed == true) {
              SerializeStruct(this_01,(FlatBufferBuilder *)local_b0,pSVar2,val);
            }
            else {
              uVar8 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
              *(undefined2 *)&(this_00->super_ParserState).prev_cursor_ = 0x100;
              uVar8 = FlatBufferBuilderImpl<false>::ReferTo
                                ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
              this_01 = (Parser *)local_b0;
              FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                        ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
            }
            break;
          case BASE_TYPE_UNION:
            uVar8 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
            *(undefined2 *)&(this_00->super_ParserState).prev_cursor_ = 0x100;
            uVar8 = FlatBufferBuilderImpl<false>::ReferTo
                              ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,uVar8);
            break;
          case BASE_TYPE_ARRAY:
            anon_unknown_0::atot<int>
                      ((anon_unknown_0 *)this_00,pVVar4[-1].constant._M_dataplus._M_p,
                       (Parser *)array,(int *)&local_128);
            *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b1a;
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,local_128.type.base_type);
            break;
          case BASE_TYPE_VECTOR64:
            iVar9 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
            *(undefined2 *)&(this_00->super_ParserState).prev_cursor_ = 0x100;
            element = FlatBufferBuilderImpl<false>::ReferTo
                                ((FlatBufferBuilderImpl<false> *)local_b0,(long)iVar9);
            this_01 = (Parser *)local_b0;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b0,element);
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                          ,0x741,"CheckedError flatbuffers::Parser::ParseArray(Value &)");
          }
          pVVar4 = val;
        } while (val != local_d8.
                        super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar10 = CONCAT26(local_78._14_2_,local_78._8_6_);
      if (uVar10 == 0) {
        __assert_fail("cur_",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                      ,0xb3,
                      "uint8_t *flatbuffers::vector_downward<>::data() const [SizeT = unsigned int]"
                     );
      }
      InlineSize(local_c0);
      std::__cxx11::string::_M_replace
                ((ulong)(local_c0 + 1),0,(char *)local_c0[1].struct_def,uVar10);
      *(undefined2 *)&(this_00->super_ParserState).prev_cursor_ = 0;
    }
    else {
      local_b8 = 0x25;
      local_128.type._0_8_ = (char *)((long)&local_128 + 0x10U);
      local_128.type._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_b8);
      local_128.type.enum_def._0_2_ = (undefined2)local_b8;
      local_128.type.enum_def._2_6_ = (undefined6)((ulong)local_b8 >> 0x10);
      builtin_strncpy((char *)local_128.type._0_8_,"Fixed-length array size is incorrect.",0x25);
      *(char *)(local_128.type._0_8_ + local_b8) = '\0';
      local_128.type.struct_def._0_2_ = local_128.type.enum_def._0_2_;
      local_128.type.struct_def._2_6_ = local_128.type.enum_def._2_6_;
      Error((Parser *)local_134._4_8_,(string *)array);
      this_00 = (Parser *)local_134._4_8_;
      if ((char *)local_128.type._0_8_ != (char *)((long)&local_128 + 0x10U)) {
        operator_delete((void *)local_128.type._0_8_,
                        CONCAT62(local_128.type.enum_def._2_6_,local_128.type.enum_def._0_2_) + 1);
        this_00 = (Parser *)local_134._4_8_;
      }
    }
  }
LAB_00114b1a:
  if (local_134[1] == '\0') {
    __assert_fail("has_been_checked_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x3a4,"flatbuffers::CheckedError::~CheckedError()");
  }
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_b0);
  std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::~vector(&local_d8);
  return SUB82(this_00,0);
}

Assistant:

CheckedError Parser::ParseArray(Value &array) {
  std::vector<Value> stack;
  FlatBufferBuilder builder;
  const auto &type = array.type.VectorType();
  auto length = array.type.fixed_length;
  size_t count = 0;
  auto err = ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
    stack.emplace_back(Value());
    auto &val = stack.back();
    val.type = type;
    if (IsStruct(type)) {
      ECHECK(ParseTable(*val.type.struct_def, &val.constant, nullptr));
    } else {
      ECHECK(ParseSingleValue(nullptr, val, false));
    }
    return NoError();
  });
  ECHECK(err);
  if (length != count) return Error("Fixed-length array size is incorrect.");

  for (auto it = stack.rbegin(); it != stack.rend(); ++it) {
    auto &val = *it;
    // clang-format off
    switch (val.type.base_type) {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) { \
            SerializeStruct(builder, *val.type.struct_def, val); \
          } else { \
            CTYPE elem; \
            ECHECK(atot(val.constant.c_str(), *this, &elem)); \
            builder.PushElement(elem); \
          } \
        break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
      default: FLATBUFFERS_ASSERT(0);
    }
    // clang-format on
  }

  array.constant.assign(
      reinterpret_cast<const char *>(builder.GetCurrentBufferPointer()),
      InlineSize(array.type));
  return NoError();
}